

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_next32From_63(UText *ut,int64_t index)

{
  UBool UVar1;
  uint uVar2;
  UChar32 UVar3;
  ulong uVar4;
  
  uVar4 = index - ut->chunkNativeStart;
  if ((index < ut->chunkNativeStart) || (ut->chunkNativeLimit <= index)) {
    UVar1 = (*ut->pFuncs->access)(ut,index,'\x01');
    if (UVar1 == '\0') {
      return -1;
    }
    uVar4 = (ulong)(uint)ut->chunkOffset;
  }
  else if ((long)ut->nativeIndexingLimit < (long)uVar4) {
    uVar2 = (*ut->pFuncs->mapNativeIndexToUTF16)(ut,index);
    uVar4 = (ulong)uVar2;
  }
  ut->chunkOffset = (int)uVar4 + 1;
  if ((ut->chunkContents[(int)uVar4] & 0xf800U) != 0xd800) {
    return (uint)(ushort)ut->chunkContents[(int)uVar4];
  }
  utext_setNativeIndex_63(ut,index);
  UVar3 = utext_next32_63(ut);
  return UVar3;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_next32From(UText *ut, int64_t index) {
    UChar32       c      = U_SENTINEL;

    if(index<ut->chunkNativeStart || index>=ut->chunkNativeLimit) {
        // Desired position is outside of the current chunk.
        if(!ut->pFuncs->access(ut, index, TRUE)) {
            // no chunk available here
            return U_SENTINEL;
        }
    } else if (index - ut->chunkNativeStart  <= (int64_t)ut->nativeIndexingLimit) {
        // Desired position is in chunk, with direct 1:1 native to UTF16 indexing
        ut->chunkOffset = (int32_t)(index - ut->chunkNativeStart);
    } else {
        // Desired position is in chunk, with non-UTF16 indexing.
        ut->chunkOffset = ut->pFuncs->mapNativeIndexToUTF16(ut, index);
    }

    c = ut->chunkContents[ut->chunkOffset++];
    if (U16_IS_SURROGATE(c)) {
        // Surrogates.  Many edge cases.  Use other functions that already
        //              deal with the problems.
        utext_setNativeIndex(ut, index);
        c = utext_next32(ut);
    }
    return c;
}